

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

CURLcode Curl_hsts_parse(hsts *h,char *hostname,char *header)

{
  char *hostname_00;
  hsts *h_00;
  _Bool _Var1;
  int iVar2;
  CURLofft CVar3;
  CURLcode CVar4;
  time_t tVar5;
  ulong uVar6;
  stsentry *psVar7;
  long lVar8;
  byte *pbVar9;
  bool bVar10;
  curl_off_t expires;
  time_t local_50;
  char *local_48;
  hsts *local_40;
  char *endp;
  
  expires = 0;
  CVar4 = CURLE_OK;
  tVar5 = time((time_t *)0x0);
  _Var1 = Curl_host_is_ipnum(hostname);
  if (!_Var1) {
    bVar10 = false;
    _Var1 = false;
    local_50 = tVar5;
    local_48 = hostname;
    local_40 = h;
    do {
      while ((*header != 0 && (iVar2 = Curl_isspace((uint)(byte)*header), iVar2 != 0))) {
        header = (char *)((byte *)header + 1);
      }
      iVar2 = Curl_strncasecompare("max-age=",header,8);
      if (iVar2 == 0) {
        iVar2 = Curl_strncasecompare("includesubdomains",header,0x11);
        if (iVar2 == 0) {
          for (; (*header != 0 && (*header != 0x3b)); header = (char *)((byte *)header + 1)) {
          }
        }
        else {
          if (_Var1) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          header = (char *)((byte *)header + 0x11);
          _Var1 = true;
        }
      }
      else {
        if (bVar10) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        for (pbVar9 = (byte *)header + 8; *pbVar9 != 0; pbVar9 = pbVar9 + 1) {
          iVar2 = Curl_isspace((uint)*pbVar9);
          if (iVar2 == 0) {
            bVar10 = *pbVar9 == 0x22;
            goto LAB_00120435;
          }
        }
        bVar10 = false;
LAB_00120435:
        CVar3 = curlx_strtoofft((char *)(pbVar9 + bVar10),&endp,10,&expires);
        if (CVar3 != CURL_OFFT_OK) {
          if (CVar3 != CURL_OFFT_FLOW) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          expires = 0x7fffffffffffffff;
        }
        header = endp;
        if (bVar10 != false) {
          if (*endp != '\"') {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          header = endp + 1;
        }
        bVar10 = true;
      }
      for (; *header != 0; header = (char *)((byte *)header + 1)) {
        iVar2 = Curl_isspace((uint)(byte)*header);
        if (iVar2 == 0) {
          uVar6 = (ulong)(*header == 0x3b);
          goto LAB_001204a5;
        }
      }
      uVar6 = 0;
LAB_001204a5:
      h_00 = local_40;
      hostname_00 = local_48;
      pbVar9 = (byte *)header + uVar6;
      header = (char *)((byte *)header + uVar6);
    } while (*pbVar9 != 0);
    CVar4 = CURLE_BAD_FUNCTION_ARGUMENT;
    if (bVar10) {
      if (expires == 0) {
        CVar4 = CURLE_OK;
        psVar7 = Curl_hsts(local_40,local_48,false);
        if (psVar7 != (stsentry *)0x0) {
          CVar4 = CURLE_OK;
          Curl_llist_remove(&h_00->list,&psVar7->node,(void *)0x0);
          (*Curl_cfree)(psVar7->host);
          (*Curl_cfree)(psVar7);
        }
      }
      else {
        lVar8 = local_50 + expires;
        if (0x7fffffffffffffff - local_50 < expires) {
          lVar8 = 0x7fffffffffffffff;
        }
        CVar4 = CURLE_OK;
        expires = lVar8;
        psVar7 = Curl_hsts(local_40,local_48,false);
        if (psVar7 == (stsentry *)0x0) {
          CVar4 = hsts_create(h_00,hostname_00,_Var1,expires);
        }
        else {
          psVar7->expires = expires;
          psVar7->includeSubDomains = _Var1;
        }
      }
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_hsts_parse(struct hsts *h, const char *hostname,
                         const char *header)
{
  const char *p = header;
  curl_off_t expires = 0;
  bool gotma = FALSE;
  bool gotinc = FALSE;
  bool subdomains = FALSE;
  struct stsentry *sts;
  time_t now = time(NULL);

  if(Curl_host_is_ipnum(hostname))
    /* "explicit IP address identification of all forms is excluded."
       / RFC 6797 */
    return CURLE_OK;

  do {
    while(*p && ISSPACE(*p))
      p++;
    if(Curl_strncasecompare("max-age=", p, 8)) {
      bool quoted = FALSE;
      CURLofft offt;
      char *endp;

      if(gotma)
        return CURLE_BAD_FUNCTION_ARGUMENT;

      p += 8;
      while(*p && ISSPACE(*p))
        p++;
      if(*p == '\"') {
        p++;
        quoted = TRUE;
      }
      offt = curlx_strtoofft(p, &endp, 10, &expires);
      if(offt == CURL_OFFT_FLOW)
        expires = CURL_OFF_T_MAX;
      else if(offt)
        /* invalid max-age */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      p = endp;
      if(quoted) {
        if(*p != '\"')
          return CURLE_BAD_FUNCTION_ARGUMENT;
        p++;
      }
      gotma = TRUE;
    }
    else if(Curl_strncasecompare("includesubdomains", p, 17)) {
      if(gotinc)
        return CURLE_BAD_FUNCTION_ARGUMENT;
      subdomains = TRUE;
      p += 17;
      gotinc = TRUE;
    }
    else {
      /* unknown directive, do a lame attempt to skip */
      while(*p && (*p != ';'))
        p++;
    }

    while(*p && ISSPACE(*p))
      p++;
    if(*p == ';')
      p++;
  } while (*p);

  if(!gotma)
    /* max-age is mandatory */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!expires) {
    /* remove the entry if present verbatim (without subdomain match) */
    sts = Curl_hsts(h, hostname, FALSE);
    if(sts) {
      Curl_llist_remove(&h->list, &sts->node, NULL);
      hsts_free(sts);
    }
    return CURLE_OK;
  }

  if(CURL_OFF_T_MAX - now < expires)
    /* would overflow, use maximum value */
    expires = CURL_OFF_T_MAX;
  else
    expires += now;

  /* check if it already exists */
  sts = Curl_hsts(h, hostname, FALSE);
  if(sts) {
    /* just update these fields */
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
  }
  else
    return hsts_create(h, hostname, subdomains, expires);

  return CURLE_OK;
}